

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  size_type *psVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppTVar4;
  int iVar5;
  tm *ptVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  UnitTestImpl *pUVar10;
  bool bVar11;
  ulong *puVar12;
  TimeInMillis ms;
  pointer ppTVar13;
  pointer ppTVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  long lVar18;
  tm time_struct;
  string kIndent;
  string kTestsuites;
  undefined1 local_2f0 [56];
  string local_2b8;
  string local_298;
  string local_278;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  long *local_1d8;
  undefined8 local_1d0;
  long local_1c8;
  undefined8 uStack_1c0;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  int local_74;
  string local_70;
  string local_50;
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"testsuites","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_298,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  pcVar2 = local_2f0 + 0x10;
  local_2f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"tests","");
  iVar5 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_278,(string *)local_2f0,iVar5,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  local_2f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"failures","");
  iVar5 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_278,(string *)local_2f0,iVar5,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  local_2f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"disabled","");
  iVar5 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_278,(string *)local_2f0,iVar5,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  local_2f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"errors","");
  OutputJsonKey(stream,&local_278,(string *)local_2f0,0,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_2f0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"random_seed","");
    OutputJsonKey(stream,&local_278,(string *)local_2f0,unit_test->impl_->random_seed_,&local_298,
                  true);
    if ((char *)local_2f0._0_8_ != pcVar2) {
      operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"timestamp","");
  local_2b8._M_dataplus._M_p = (pointer)(unit_test->impl_->start_timestamp_ / 1000);
  ptVar6 = localtime_r((time_t *)&local_2b8,(tm *)local_2f0);
  if (ptVar6 == (tm *)0x0) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity =
         local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_00544201;
  }
  local_74 = local_2f0._20_4_ + 0x76c;
  StreamableToString<int>(&local_50,&local_74);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_248 = *puVar12;
    lStack_240 = plVar7[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *puVar12;
    local_258 = (ulong *)*plVar7;
  }
  local_250 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_98,(String *)(ulong)(local_2f0._16_4_ + 1),(int)local_250);
  uVar15 = 0xf;
  if (local_258 != &local_248) {
    uVar15 = local_248;
  }
  if (uVar15 < local_98._M_string_length + local_250) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar16 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_98._M_string_length + local_250) goto LAB_00543a05;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_258);
  }
  else {
LAB_00543a05:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_98._M_dataplus._M_p);
  }
  local_1f8 = &local_1e8;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_1e8 = *plVar7;
    uStack_1e0 = puVar8[3];
  }
  else {
    local_1e8 = *plVar7;
    local_1f8 = (long *)*puVar8;
  }
  local_1f0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_228 = *puVar12;
    lStack_220 = plVar7[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar12;
    local_238 = (ulong *)*plVar7;
  }
  local_230 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_b8,(String *)(ulong)(uint)local_2f0._12_4_,(int)local_230);
  uVar15 = 0xf;
  if (local_238 != &local_228) {
    uVar15 = local_228;
  }
  if (uVar15 < local_b8._M_string_length + local_230) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar16 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_b8._M_string_length + local_230) goto LAB_00543b4b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_00543b4b:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_b8._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_1c8 = *plVar7;
    uStack_1c0 = puVar8[3];
  }
  else {
    local_1c8 = *plVar7;
    local_1d8 = (long *)*puVar8;
  }
  local_1d0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_208 = *puVar12;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar12;
    local_218 = (ulong *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_d8,(String *)(ulong)(uint)local_2f0._8_4_,(int)local_210);
  uVar15 = 0xf;
  if (local_218 != &local_208) {
    uVar15 = local_208;
  }
  if (uVar15 < local_d8._M_string_length + local_210) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar16 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_d8._M_string_length + local_210) goto LAB_00543c91;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_218);
  }
  else {
LAB_00543c91:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_d8._M_dataplus._M_p);
  }
  local_1b8 = &local_1a8;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_1a8 = *plVar7;
    uStack_1a0 = puVar8[3];
  }
  else {
    local_1a8 = *plVar7;
    local_1b8 = (long *)*puVar8;
  }
  local_1b0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_168 = *puVar12;
    lStack_160 = plVar7[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar12;
    local_178 = (ulong *)*plVar7;
  }
  local_170 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_f8,(String *)((ulong)local_2f0._0_8_ >> 0x20),(int)local_170);
  uVar15 = 0xf;
  if (local_178 != &local_168) {
    uVar15 = local_168;
  }
  if (uVar15 < local_f8._M_string_length + local_170) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar16 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_f8._M_string_length + local_170) goto LAB_00543dd7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_00543dd7:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_f8._M_dataplus._M_p);
  }
  local_198 = &local_188;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_188 = *plVar7;
    uStack_180 = puVar8[3];
  }
  else {
    local_188 = *plVar7;
    local_198 = (long *)*puVar8;
  }
  local_190 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_148 = *puVar12;
    lStack_140 = plVar7[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar12;
    local_158 = (ulong *)*plVar7;
  }
  local_150 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_118,(String *)(local_2f0._0_8_ & 0xffffffff),(int)local_150);
  uVar15 = 0xf;
  if (local_158 != &local_148) {
    uVar15 = local_148;
  }
  if (uVar15 < local_118._M_string_length + local_150) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar16 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_118._M_string_length + local_150) goto LAB_00543f1f;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_00543f1f:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_118._M_dataplus._M_p);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2b8.field_2._M_allocated_capacity = *psVar1;
    local_2b8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar1;
    local_2b8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2b8._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  puVar12 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_138.field_2._M_allocated_capacity = *puVar12;
    local_138.field_2._8_8_ = plVar7[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *puVar12;
    local_138._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_138._M_string_length = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_00544201:
  OutputJsonKey(stream,&local_278,&local_70,&local_138,&local_298,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_2f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_2b8,(internal *)unit_test->impl_->elapsed_time_,ms)
  ;
  OutputJsonKey(stream,&local_278,(string *)local_2f0,&local_2b8,&local_298,false);
  paVar3 = &local_2b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  TestPropertiesAsJson((string *)local_2f0,&unit_test->impl_->ad_hoc_test_result_,&local_298);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_2f0._0_8_,CONCAT44(local_2f0._12_4_,local_2f0._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",\n",2);
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  local_2f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"name","");
  local_2b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"AllTests","");
  OutputJsonKey(stream,&local_278,(string *)local_2f0,&local_2b8,&local_298,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2f0._0_8_ != pcVar2) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) + 1);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\": [\n",5);
  pUVar10 = unit_test->impl_;
  ppTVar13 = (pUVar10->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar10->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar13) >> 3)) {
    lVar18 = 0;
    bVar11 = false;
    do {
      ppTVar14 = (ppTVar13[lVar18]->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar4 = *(pointer *)
                 ((long)&(ppTVar13[lVar18]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar14 != ppTVar4) {
        iVar5 = 0;
        do {
          uVar17 = (*ppTVar14)->is_in_another_shard_ ^ 1;
          if ((*ppTVar14)->matches_filter_ == false) {
            uVar17 = 0;
          }
          iVar5 = iVar5 + uVar17;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != ppTVar4);
        if (iVar5 != 0) {
          if (bVar11) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar10 = unit_test->impl_;
          }
          PrintJsonTestCase(stream,(pUVar10->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar18]);
          pUVar10 = unit_test->impl_;
          bVar11 = true;
        }
      }
      lVar18 = lVar18 + 1;
      ppTVar13 = (pUVar10->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (lVar18 < (int)((ulong)((long)(pUVar10->test_cases_).
                                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppTVar13) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}